

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O1

void __thiscall
fmt::BufferedFile::BufferedFile(BufferedFile *this,CStringRef filename,CStringRef mode)

{
  FILE *pFVar1;
  int *piVar2;
  SystemError *this_00;
  BasicCStringRef<char> local_20;
  
  local_20.data_ = filename.data_;
  do {
    pFVar1 = fopen(local_20.data_,mode.data_);
    this->file_ = (FILE *)pFVar1;
    if (pFVar1 != (FILE *)0x0) {
      return;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  this_00 = (SystemError *)__cxa_allocate_exception(0x18);
  piVar2 = __errno_location();
  SystemError::SystemError<fmt::BasicCStringRef<char>>
            (this_00,*piVar2,(CStringRef)0x13b1eb,&local_20);
  __cxa_throw(this_00,&SystemError::typeinfo,SystemError::~SystemError);
}

Assistant:

fmt::BufferedFile::BufferedFile(
    fmt::CStringRef filename, fmt::CStringRef mode) {
  FMT_RETRY_VAL(file_, FMT_SYSTEM(fopen(filename.c_str(), mode.c_str())), 0);
  if (!file_)
    FMT_THROW(SystemError(errno, "cannot open file {}", filename));
}